

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_base_boundary_z2_methods<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>>
               (void)

{
  initializer_list<bool> __l;
  initializer_list<bool> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<bool> __l_02;
  initializer_list<unsigned_int> __l_03;
  undefined8 uVar1;
  bool bVar2;
  uint columnIndex;
  size_type sVar3;
  lazy_ostream *plVar4;
  undefined4 local_5a4;
  size_t local_5a0;
  basic_cstring<const_char> local_598;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_588;
  basic_cstring<const_char> local_560;
  basic_cstring<const_char> local_550;
  basic_cstring<const_char> local_540;
  basic_cstring<const_char> local_530;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_520;
  vector<bool,_std::allocator<bool>_> local_500;
  assertion_result local_4d8;
  basic_cstring<const_char> local_4c0;
  basic_cstring<const_char> local_4b0;
  initializer_list<bool> local_4a0;
  undefined4 local_48c;
  size_t local_488;
  basic_cstring<const_char> local_480;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_470;
  basic_cstring<const_char> local_448;
  basic_cstring<const_char> local_438;
  basic_cstring<const_char> local_428;
  basic_cstring<const_char> local_418;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_408;
  vector<bool,_std::allocator<bool>_> local_3e8;
  assertion_result local_3c0;
  basic_cstring<const_char> local_3a8;
  basic_cstring<const_char> local_398;
  bool local_387 [7];
  iterator local_380;
  undefined8 local_378;
  undefined4 local_36c;
  size_t local_368;
  basic_cstring<const_char> local_360;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_350;
  basic_cstring<const_char> local_328;
  basic_cstring<const_char> local_318;
  basic_cstring<const_char> local_308;
  basic_cstring<const_char> local_2f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2e8;
  vector<bool,_std::allocator<bool>_> local_2c8;
  assertion_result local_2a0;
  basic_cstring<const_char> local_288;
  basic_cstring<const_char> local_278;
  bool local_267 [7];
  iterator local_260;
  undefined8 local_258;
  allocator<unsigned_int> local_249;
  uint local_248 [8];
  iterator local_228;
  size_type local_220;
  undefined1 local_218 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> permutation;
  size_t local_1f8;
  basic_cstring<const_char> local_1f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1e0;
  basic_cstring<const_char> local_1b8;
  basic_cstring<const_char> local_1a8;
  basic_cstring<const_char> local_198;
  basic_cstring<const_char> local_188;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_178;
  vector<bool,_std::allocator<bool>_> local_158;
  assertion_result local_130;
  basic_cstring<const_char> local_118;
  basic_cstring<const_char> local_108;
  bool local_f7 [7];
  iterator local_f0;
  undefined8 local_e8;
  allocator<unsigned_int> local_d9;
  uint local_d8 [6];
  iterator local_c0;
  size_type local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  undefined1 local_98 [8];
  Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
  col;
  Column_z2_settings local_31;
  undefined1 local_30 [7];
  Column_settings settings;
  vector<bool,_std::allocator<bool>_> veccont;
  
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_30);
  Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>
  ::Column_z2_settings::Column_z2_settings(&local_31);
  local_d8[0] = 0;
  local_d8[1] = 1;
  local_d8[2] = 2;
  local_d8[3] = 5;
  local_d8[4] = 6;
  local_c0 = local_d8;
  local_b8 = 5;
  std::allocator<unsigned_int>::allocator(&local_d9);
  __l_03._M_len = local_b8;
  __l_03._M_array = local_c0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_b0,__l_03,&local_d9);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>
  ::Set_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>
              *)local_98,&local_b0,&local_31);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_b0);
  std::allocator<unsigned_int>::~allocator(&local_d9);
  local_f7[0] = true;
  local_f7[1] = true;
  local_f7[2] = true;
  local_f7[3] = false;
  local_f7[4] = false;
  local_f7[5] = true;
  local_f7[6] = true;
  local_f0 = local_f7;
  local_e8 = 7;
  __l_02._M_len = 7;
  __l_02._M_array = local_f0;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_30,__l_02);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_118);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_108,0x290,&local_118);
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_30);
    Gudhi::persistence_matrix::
    Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
    ::get_content(&local_158,
                  (Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                   *)local_98,(int)sVar3);
    bVar2 = std::operator==(&local_158,(vector<bool,_std::allocator<bool>_> *)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_130,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_188,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_178,plVar4,&local_188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_130,&local_178,&local_198,0x290,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_178);
    boost::test_tools::assertion_result::~assertion_result(&local_130);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1a8,0x291,&local_1b8);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1e0,plVar4,(char (*) [1])0x28c14a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_1f8 = Gudhi::persistence_matrix::
                Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                ::size((Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                        *)local_98);
    permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_1e0,&local_1f0,0x291,1,2,&local_1f8,"col.size()",
               (undefined1 *)
               ((long)&permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4),"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_248[4] = 1;
  local_248[5] = 4;
  local_248[6] = 6;
  local_248[0] = 0;
  local_248[1] = 5;
  local_248[2] = 2;
  local_248[3] = 3;
  local_228 = local_248;
  local_220 = 7;
  std::allocator<unsigned_int>::allocator(&local_249);
  __l_01._M_len = local_220;
  __l_01._M_array = local_228;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_218,__l_01,&local_249);
  std::allocator<unsigned_int>::~allocator(&local_249);
  columnIndex = Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>
                ::get_null_value<unsigned_int>();
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>
  ::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>
              *)local_98,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_218,
             columnIndex);
  local_267[0] = true;
  local_267[1] = false;
  local_267[2] = true;
  local_267[3] = false;
  local_267[4] = true;
  local_267[5] = true;
  local_267[6] = true;
  local_260 = local_267;
  local_258 = 7;
  __l_00._M_len = 7;
  __l_00._M_array = local_260;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_30,__l_00);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_288);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_278,0x296,&local_288);
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_30);
    Gudhi::persistence_matrix::
    Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
    ::get_content(&local_2c8,
                  (Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                   *)local_98,(int)sVar3);
    bVar2 = std::operator==(&local_2c8,(vector<bool,_std::allocator<bool>_> *)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_2a0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_2e8,plVar4,&local_2f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_308,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_2a0,&local_2e8,&local_308,0x296,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2e8);
    boost::test_tools::assertion_result::~assertion_result(&local_2a0);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_2c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_318,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_328);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_318,0x297,&local_328);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_350,plVar4,(char (*) [1])0x28c14a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_360,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_368 = Gudhi::persistence_matrix::
                Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                ::size((Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                        *)local_98);
    local_36c = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_350,&local_360,0x297,1,2,&local_368,"col.size()",&local_36c,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_350);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
  ::clear((Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
           *)local_98,2);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
  ::clear((Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
           *)local_98,6);
  local_387[0] = true;
  local_387[1] = false;
  local_387[2] = false;
  local_387[3] = false;
  local_387[4] = true;
  local_387[5] = true;
  local_387[6] = false;
  local_380 = local_387;
  local_378 = 7;
  __l._M_len = 7;
  __l._M_array = local_380;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_30,__l);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_398,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_398,0x29c,&local_3a8);
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_30);
    Gudhi::persistence_matrix::
    Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
    ::get_content(&local_3e8,
                  (Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                   *)local_98,(int)sVar3);
    bVar2 = std::operator==(&local_3e8,(vector<bool,_std::allocator<bool>_> *)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_3c0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_418,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_408,plVar4,&local_418);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_3c0,&local_408,&local_428,0x29c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_408);
    boost::test_tools::assertion_result::~assertion_result(&local_3c0);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_3e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_438,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_448);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_438,0x29d,&local_448);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_470,plVar4,(char (*) [1])0x28c14a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_480,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_488 = Gudhi::persistence_matrix::
                Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                ::size((Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                        *)local_98);
    local_48c = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_470,&local_480,0x29d,1,2,&local_488,"col.size()",&local_48c,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_470);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
  ::clear((Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
           *)local_98);
  std::initializer_list<bool>::initializer_list(&local_4a0);
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_30,local_4a0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4b0,0x2a1,&local_4c0);
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_30);
    Gudhi::persistence_matrix::
    Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
    ::get_content(&local_500,
                  (Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                   *)local_98,(int)sVar3);
    bVar2 = std::operator==(&local_500,(vector<bool,_std::allocator<bool>_> *)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_4d8,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_530,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_520,plVar4,&local_530);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_540,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_4d8,&local_520,&local_540,0x2a1,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_520);
    boost::test_tools::assertion_result::~assertion_result(&local_4d8);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_500);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_550,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_560);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_550,0x2a2,&local_560);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_588,plVar4,(char (*) [1])0x28c14a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_598,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_5a0 = Gudhi::persistence_matrix::
                Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                ::size((Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                        *)local_98);
    local_5a4 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_588,&local_598,0x2a2,1,2,&local_5a0,"col.size()",&local_5a4,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_588);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_218);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
  ::~Set_column((Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                 *)local_98);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_30)
  ;
  return;
}

Assistant:

void column_test_base_boundary_z2_methods() {
  std::vector<typename Column::Field_element> veccont;
  typename Column::Column_settings settings;

  Column col(std::vector<unsigned int>{0, 1, 2, 5, 6}, &settings);
  veccont = {1, 1, 1, 0, 0, 1, 1};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 5);

  std::vector<unsigned int> permutation{0, 5, 2, 3, 1, 4, 6};
  col.reorder(permutation);
  veccont = {1, 0, 1, 0, 1, 1, 1};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 5);

  col.clear(2);
  col.clear(6);
  veccont = {1, 0, 0, 0, 1, 1, 0};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 3);

  col.clear();
  veccont = {};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 0);
}